

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

double runnameAndTorsion(xformDatabase *xdb,char *buf,int max)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  biasFunction *local_48;
  biasFunction *f;
  double phi;
  double bias;
  int n;
  int i;
  char *p;
  int max_local;
  char *buf_local;
  xformDatabase *xdb_local;
  
  phi = 0.0;
  if ((xdb != (xformDatabase *)0x0) && (buf != (char *)0x0)) {
    phi = 0.0;
    _n = buf;
    p._4_4_ = max;
    for (bias._4_4_ = 0; bias._4_4_ < xdb->nlevs; bias._4_4_ = bias._4_4_ + 1) {
      if (0xf < p._4_4_) {
        iVar2 = sprintf(_n,"%g ",xdb->level[bias._4_4_]->currVal);
        _n = _n + iVar2;
        p._4_4_ = p._4_4_ - iVar2;
      }
      for (local_48 = xdb->level[bias._4_4_]->funcs; local_48 != (biasFunction *)0x0;
          local_48 = local_48->next) {
        if (local_48->type == 0) {
          phi = local_48->v + phi;
        }
        else if (local_48->type == 2) {
          dVar1 = local_48->v;
          dVar3 = pow(xdb->level[bias._4_4_]->currVal - local_48->ph,local_48->freq);
          phi = dVar1 * dVar3 + phi;
        }
        else if (local_48->type == 1) {
          dVar1 = local_48->v;
          dVar3 = local_48->shift;
          dVar4 = cos(local_48->freq * 0.017453293 *
                      (xdb->level[bias._4_4_]->currVal - local_48->ph));
          phi = dVar1 * 0.5 * (dVar3 - dVar4) + phi;
        }
      }
    }
  }
  return phi;
}

Assistant:

double runnameAndTorsion(xformDatabase* xdb, char* buf, int max) {
   char *p = NULL;
   int i = 0, n = 0;
   double bias = 0.0, phi = 0.0;
   biasFunction *f = NULL;

   if (xdb && buf) {
      bias = 0.0;
      p = buf; /*dcr?: (dcr guesses) that p now points to beginning of buf */
      for(i = 0; i < xdb->nlevs; i++) {
	 if (max > 15) { /* add value to the output buffer */
	    n = sprintf(p, "%g ", xdb->level[i]->currVal);
	            /*dcr?: that sprintf wrote n char into buf starting at p*/
	    p += n; 
                    /*dcr?: p now points n nchar further along in buf*/
                    /*note the space after the %g conversion of double currVal*/
                    /*so when next char written they will have a space between*/
	    max -= n; 

            /*dcr?: max tracks available space in buf, now decremented by n */
            /*buf holds the angle values in order of their use*/
            /*it would be nice to reorder those values for output to .map file*/
            /*e.g. so plotting of phi,tau,psi could be as phi,psi,tau ! */
            /*probably this should be done at the output stage anyway*/
            /*autobondrot output is from probe.c/rawEnumerate() where */
            /*angle values are called char *rawname  which seems to == buf */
	 }

	 /* sum up any bias functions */

	 for(f = xdb->level[i]->funcs; f; f = f->next) {
	    if (f->type == CONSTbiasfunc) {
	       bias += f->v;
	    }
	    else if (f->type == POLYbiasfunc) {
	       bias += f->v * pow(xdb->level[i]->currVal - f->ph, f->freq);
	    }
	    else if (f->type == COSbiasfunc) {
	       phi = f->freq * DEG2RAD * (xdb->level[i]->currVal - f->ph);
	       bias += f->v * 0.5 * (f->shift - cos(phi));
	    }
	 }
      }
   }
   return bias;
}